

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

void __thiscall
soul::RewritingASTVisitor::
replaceArray<std::vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>>
          (RewritingASTVisitor *this,
          vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
          *array)

{
  bool bVar1;
  Function *pFVar2;
  reference pvVar3;
  pool_ref<soul::AST::Function> local_50 [3];
  pool_ref<soul::AST::Function> local_38;
  pool_ref<soul::AST::Function> local_30;
  pool_ref<soul::AST::Function> newObject;
  value_type oldObject;
  size_t i;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *array_local;
  RewritingASTVisitor *this_local;
  
  for (oldObject.object = (Function *)0x0;
      pFVar2 = (Function *)
               std::
               vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
               ::size(array), oldObject.object < pFVar2;
      oldObject.object =
           (Function *)((long)&((oldObject.object)->super_ASTObject)._vptr_ASTObject + 1)) {
    pvVar3 = std::
             vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
             ::operator[](array,(size_type)oldObject.object);
    local_38.object = pvVar3->object;
    newObject.object = local_38.object;
    visitAs<soul::AST::Function>
              ((RewritingASTVisitor *)&stack0xffffffffffffffd0,(pool_ref<soul::AST::Function> *)this
              );
    pool_ref<soul::AST::Function>::~pool_ref(&local_38);
    local_50[0].object = local_30.object;
    bVar1 = pool_ref<soul::AST::Function>::operator!=(&newObject,local_50);
    pool_ref<soul::AST::Function>::~pool_ref(local_50);
    if (bVar1) {
      pvVar3 = std::
               vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
               ::operator[](array,(size_type)oldObject.object);
      pvVar3->object = local_30.object;
      this->itemsReplaced = this->itemsReplaced + 1;
    }
    pool_ref<soul::AST::Function>::~pool_ref(&stack0xffffffffffffffd0);
    pool_ref<soul::AST::Function>::~pool_ref(&newObject);
  }
  return;
}

Assistant:

void replaceArray (ArrayType& array)
    {
        // this gubbins is all needed to survive cases where a visit causes the list to be mutated
        for (size_t i = 0; i < array.size(); ++i)
        {
            auto oldObject = array[i];
            auto newObject = visitAs<typename ArrayType::value_type::ObjectType> (oldObject);

            if (oldObject != newObject)
            {
                array[i] = newObject;
                ++itemsReplaced;
            }
        }
    }